

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv__fs_statx(int fd,char *path,int is_fstat,int is_lstat,uv_stat_t *buf)

{
  int iVar1;
  int *piVar2;
  int rc;
  int mode;
  int flags;
  int dirfd;
  uv__statx statxbuf;
  uv_stat_t *buf_local;
  int is_lstat_local;
  int is_fstat_local;
  char *path_local;
  int fd_local;
  
  if (uv__fs_statx::no_statx == 0) {
    mode = -100;
    rc = 0;
    if (is_fstat != 0) {
      rc = 0x1000;
      mode = fd;
    }
    if (is_lstat != 0) {
      rc = rc | 0x100;
    }
    statxbuf.unused1[0xd] = (uint64_t)buf;
    iVar1 = uv__statx(mode,path,rc,0xfff,(uv__statx *)&flags);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if ((((*piVar2 != 0x16) && (piVar2 = __errno_location(), *piVar2 != 1)) &&
          (piVar2 = __errno_location(), *piVar2 != 0x26)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x5f)) {
        return -1;
      }
    }
    else if (iVar1 == 0) {
      uv__statx_to_stat((uv__statx *)&flags,(uv_stat_t *)statxbuf.unused1[0xd]);
      return 0;
    }
    uv__fs_statx::no_statx = 1;
  }
  return -0x26;
}

Assistant:

static int uv__fs_statx(int fd,
                        const char* path,
                        int is_fstat,
                        int is_lstat,
                        uv_stat_t* buf) {
  STATIC_ASSERT(UV_ENOSYS != -1);
#ifdef __linux__
  static _Atomic int no_statx;
  struct uv__statx statxbuf;
  int dirfd;
  int flags;
  int mode;
  int rc;

  if (atomic_load_explicit(&no_statx, memory_order_relaxed))
    return UV_ENOSYS;

  dirfd = AT_FDCWD;
  flags = 0; /* AT_STATX_SYNC_AS_STAT */
  mode = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */

  if (is_fstat) {
    dirfd = fd;
    flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    flags |= AT_SYMLINK_NOFOLLOW;

  rc = uv__statx(dirfd, path, flags, mode, &statxbuf);

  switch (rc) {
  case 0:
    break;
  case -1:
    /* EPERM happens when a seccomp filter rejects the system call.
     * Has been observed with libseccomp < 2.3.3 and docker < 18.04.
     * EOPNOTSUPP is used on DVS exported filesystems
     */
    if (errno != EINVAL && errno != EPERM && errno != ENOSYS && errno != EOPNOTSUPP)
      return -1;
    /* Fall through. */
  default:
    /* Normally on success, zero is returned and On error, -1 is returned.
     * Observed on S390 RHEL running in a docker container with statx not
     * implemented, rc might return 1 with 0 set as the error code in which
     * case we return ENOSYS.
     */
    atomic_store_explicit(&no_statx, 1, memory_order_relaxed);
    return UV_ENOSYS;
  }

  uv__statx_to_stat(&statxbuf, buf);

  return 0;
#else
  return UV_ENOSYS;
#endif /* __linux__ */
}